

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O0

void __thiscall
tchecker::clock_updates_list_t::absorbing_merge(clock_updates_list_t *this,clock_updates_list_t *l)

{
  bool bVar1;
  const_iterator_t __first;
  const_iterator_t __last;
  __normal_iterator<tchecker::clock_update_t_*,_std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>_>
  local_28;
  const_iterator local_20;
  clock_updates_list_t *local_18;
  clock_updates_list_t *l_local;
  clock_updates_list_t *this_local;
  
  local_18 = l;
  l_local = this;
  bVar1 = empty(this);
  if ((!bVar1) && (bVar1 = empty(local_18), !bVar1)) {
    local_28._M_current =
         (clock_update_t *)
         std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::end
                   (&this->_list);
    __gnu_cxx::
    __normal_iterator<tchecker::clock_update_t_const*,std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>>
    ::__normal_iterator<tchecker::clock_update_t*>
              ((__normal_iterator<tchecker::clock_update_t_const*,std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>>
                *)&local_20,&local_28);
    __first = begin(local_18);
    __last = end(local_18);
    std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>::
    insert<__gnu_cxx::__normal_iterator<tchecker::clock_update_t_const*,std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>>,void>
              ((vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>> *)this,
               local_20,(__normal_iterator<const_tchecker::clock_update_t_*,_std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>_>
                         )__first._M_current,
               (__normal_iterator<const_tchecker::clock_update_t_*,_std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>_>
                )__last._M_current);
    return;
  }
  clear(this);
  return;
}

Assistant:

void clock_updates_list_t::absorbing_merge(tchecker::clock_updates_list_t const & l)
{
  if (empty() || l.empty())
    clear();
  else
    _list.insert(_list.end(), l.begin(), l.end());
}